

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

EnumVar * __thiscall
kratos::Generator::enum_var(Generator *this,string *var_name,shared_ptr<kratos::Enum> *enum_def)

{
  allocator<const_kratos::IRNode_*> *this_00;
  initializer_list<const_kratos::IRNode_*> __l;
  bool bVar1;
  element_type *peVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar3 [16];
  string_view format_str;
  format_args args;
  Generator *local_130;
  undefined1 local_128 [8];
  shared_ptr<kratos::EnumVar> p;
  undefined1 local_110 [24];
  pointer local_f8;
  size_type local_f0;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_e8;
  string local_c0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  shared_ptr<kratos::Enum> *enum_def_local;
  string *var_name_local;
  Generator *this_local;
  undefined8 local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  Context *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  Context *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)enum_def;
  enum_def_local = (shared_ptr<kratos::Enum> *)var_name;
  var_name_local = (string *)this;
  bVar1 = has_var(this,var_name);
  if (!bVar1) {
    local_130 = this;
    std::
    make_shared<kratos::EnumVar,kratos::Generator*,std::__cxx11::string_const&,std::shared_ptr<kratos::Enum>const&>
              ((Generator **)local_128,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
               enum_def_local);
    std::
    map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
    ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::EnumVar>&>
              ((map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                *)&this->vars_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)enum_def_local,
               (shared_ptr<kratos::EnumVar> *)local_128);
    peVar2 = std::__shared_ptr_access<kratos::EnumVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<kratos::EnumVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_128);
    std::shared_ptr<kratos::EnumVar>::~shared_ptr((shared_ptr<kratos::EnumVar> *)local_128);
    return peVar2;
  }
  p.super___shared_ptr<kratos::EnumVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1;
  auVar3 = __cxa_allocate_exception(0x10);
  local_40._8_8_ = &local_c0;
  local_40._M_allocated_capacity = (long)"function {0} already exists" + 9;
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)enum_def_local;
  local_68.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string_const&,char[19],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x43e48f,(v7 *)enum_def_local,auVar3._8_8_,
                  (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)0x43e48f);
  local_50 = &local_68;
  local_78 = fmt::v7::to_string_view<char,_0>((char *)local_40._M_allocated_capacity);
  local_28 = (Context *)&this_local;
  local_30 = local_50;
  local_20 = local_50;
  local_10 = local_50;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_28,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_50->string);
  format_str.size_ = (size_t)this_local;
  format_str.data_ = (char *)local_78.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = local_80;
  fmt::v7::detail::vformat_abi_cxx11_(&local_c0,(detail *)local_78.data_,format_str,args);
  get_var((Generator *)local_110,(string *)this);
  local_110._16_8_ =
       std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                 ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_110);
  local_f8 = (pointer)(local_110 + 0x10);
  local_f0 = 1;
  this_00 = (allocator<const_kratos::IRNode_*> *)
            ((long)&p.super___shared_ptr<kratos::EnumVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi + 7);
  std::allocator<const_kratos::IRNode_*>::allocator(this_00);
  __l._M_len = local_f0;
  __l._M_array = (iterator)local_f8;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_e8,__l,this_00);
  VarException::VarException(auVar3._0_8_,&local_c0,&local_e8);
  p.super___shared_ptr<kratos::EnumVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0;
  __cxa_throw(auVar3._0_8_,&VarException::typeinfo,VarException::~VarException);
}

Assistant:

EnumVar &Generator::enum_var(const std::string &var_name, const std::shared_ptr<Enum> &enum_def) {
    if (has_var(var_name))
        throw VarException(::format("{0} already exists", var_name), {get_var(var_name).get()});
    auto p = std::make_shared<EnumVar>(this, var_name, enum_def);
    vars_.emplace(var_name, p);
    return *p;
}